

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O2

void __thiscall Minisat::Solver::MyQueue<int>::push(MyQueue<int> *this,int e)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  int64_t iVar4;
  
  if (this->q_sz < this->max_sz) {
    this->q_sz = this->q_sz + 1;
    iVar4 = this->sum;
    iVar2 = this->ptr;
    piVar1 = (this->q).data;
    lVar3 = (long)iVar2;
  }
  else {
    iVar2 = this->ptr;
    piVar1 = (this->q).data;
    lVar3 = (long)iVar2;
    iVar4 = this->sum - (long)piVar1[lVar3];
  }
  this->sum = iVar4 + e;
  this->ptr = iVar2 + 1;
  piVar1[lVar3] = e;
  if (this->ptr == this->max_sz) {
    this->ptr = 0;
  }
  return;
}

Assistant:

void push(T e)
        {
            if (q_sz < max_sz)
                q_sz++;
            else
                sum -= q[ptr];
            sum += e;
            q[ptr++] = e;
            if (ptr == max_sz) ptr = 0;
        }